

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
(anonymous_namespace)::evalLogicalOp<slang::SVInt,bool>
          (ConstantValue *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryOperator op,
          SVInt *l,bool *r)

{
  bool bVar1;
  logic_error *this_00;
  undefined4 in_register_00000014;
  SVInt *lhs;
  string local_180;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  SVInt local_b8;
  uint8_t local_a1;
  SVInt local_a0;
  SVInt local_90;
  uint8_t local_79;
  SVInt local_78;
  uint8_t local_61;
  SVInt local_60 [2];
  uint8_t local_39;
  SVInt local_38;
  SVInt *local_28;
  bool *r_local;
  SVInt *l_local;
  ConstantValue *pCStack_10;
  BinaryOperator op_local;
  
  lhs = (SVInt *)CONCAT44(in_register_00000014,op);
  l_local._4_4_ = SUB84(this,0);
  local_28 = l;
  r_local = (bool *)lhs;
  pCStack_10 = __return_storage_ptr__;
  switch(l_local._4_4_) {
  case 0x13:
    local_39 = (uint8_t)slang::SVInt::operator_cast_to_logic_t(lhs);
    bVar1 = slang::operator&&((logic_t)local_39,
                              (bool)(*(byte *)&(local_28->super_SVIntStorage).field_0 & 1));
    slang::SVInt::SVInt<bool,void>(&local_38,bVar1);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_38);
    slang::SVInt::~SVInt(&local_38);
    break;
  case 0x14:
    local_61 = (uint8_t)slang::SVInt::operator_cast_to_logic_t(lhs);
    bVar1 = slang::operator||((logic_t)local_61,
                              (bool)(*(byte *)&(local_28->super_SVIntStorage).field_0 & 1));
    slang::SVInt::SVInt<bool,void>(local_60,bVar1);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_60);
    slang::SVInt::~SVInt(local_60);
    break;
  case 0x15:
    slang::SVInt::SVInt<bool,void>(&local_90,(bool)(*(byte *)&(l->super_SVIntStorage).field_0 & 1));
    local_79 = (uint8_t)slang::SVInt::logicalImpl(lhs,&local_90);
    slang::SVInt::SVInt(&local_78,(logic_t)local_79);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_78);
    slang::SVInt::~SVInt(&local_78);
    slang::SVInt::~SVInt(&local_90);
    break;
  case 0x16:
    slang::SVInt::SVInt<bool,void>(&local_b8,(bool)(*(byte *)&(l->super_SVIntStorage).field_0 & 1));
    local_a1 = (uint8_t)slang::SVInt::logicalEquiv(lhs,&local_b8);
    slang::SVInt::SVInt(&local_a0,(logic_t)local_a1);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_a0);
    slang::SVInt::~SVInt(&local_a0);
    slang::SVInt::~SVInt(&local_b8);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_159);
    std::operator+(&local_138,&local_158,":");
    std::__cxx11::to_string(&local_180,0x2a);
    std::operator+(&local_118,&local_138,&local_180);
    std::operator+(&local_f8,&local_118,": ");
    std::operator+(&local_d8,&local_f8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_d8);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue evalLogicalOp(BinaryOperator op, const TL& l, const TR& r) {
    switch (op) {
        OP(LogicalAnd, SVInt(logic_t(l) && r));
        OP(LogicalOr, SVInt(logic_t(l) || r));
        OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
        OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
        default:
            ASSUME_UNREACHABLE;
    }
}